

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_ironlich.cpp
# Opt level: O1

int AF_A_LichAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  PClassActor *pPVar9;
  AActor *pAVar10;
  FState *newstate;
  AActor *pAVar11;
  FSoundID *sound_id;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  double dVar14;
  FSoundID local_68;
  FName local_64;
  FSoundID local_60;
  FName local_5c;
  FSoundID local_58;
  FName local_54;
  DVector3 local_50;
  DAngle local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005a5e97;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = *(AActor **)&param->field_0;
    pVVar12 = param;
    uVar5 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (self->super_DThinker).super_DObject.Class;
      bVar13 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar13;
      uVar5 = (uint)bVar13;
      pVVar12 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar13);
      if (pPVar8 != pPVar3 && !bVar13) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005a5e97;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005a5e6c;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar12,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar13 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar13) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar13 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar13) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005a5e97;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar10 = (self->target).field_0.p;
      if ((pAVar10 != (AActor *)0x0) &&
         (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->target).field_0.p = (AActor *)0x0;
        pAVar10 = (AActor *)0x0;
      }
      if (pAVar10 != (AActor *)0x0) {
        A_FaceTarget(self);
        bVar13 = AActor::CheckMeleeRange(self);
        if (bVar13) {
          uVar5 = FRandom::GenRand32(&pr_atk);
          iVar4 = (uVar5 & 7) * 6 + 6;
          local_54.Index = 0x84;
          local_38.Degrees = 0.0;
          iVar6 = P_DamageMobj(pAVar10,self,self,iVar4,&local_54,0,&local_38);
          if (0 < iVar6) {
            iVar4 = iVar6;
          }
          P_TraceBleed(iVar4,pAVar10,self);
        }
        else {
          dVar14 = AActor::Distance2D(self,pAVar10,false);
          uVar5 = FRandom::GenRand32(&pr_atk);
          if ((int)(uVar5 & 0xff) < AF_A_LichAttack::atkResolve1[512.0 < dVar14]) {
            pPVar9 = PClass::FindActor("HeadFX1");
            P_SpawnMissile(self,pAVar10,pPVar9,(AActor *)0x0);
            iVar4 = S_FindSound("ironlich/attack2");
            sound_id = &local_58;
          }
          else {
            if ((int)(uVar5 & 0xff) < AF_A_LichAttack::atkResolve2[512.0 < dVar14]) {
              pPVar9 = PClass::FindActor("HeadFX3");
              pAVar10 = P_SpawnMissile(self,pAVar10,pPVar9,(AActor *)0x0);
              if (pAVar10 == (AActor *)0x0) {
                return 0;
              }
              local_5c.Index = FName::NameManager::FindName(&FName::NameData,"NoGrow",false);
              newstate = AActor::FindState(pAVar10,&local_5c);
              AActor::SetState(pAVar10,newstate,false);
              iVar4 = 2;
              do {
                local_64.Index = FName::NameManager::FindName(&FName::NameData,"HeadFX3",false);
                local_50.X = (pAVar10->__Pos).X;
                local_50.Y = (pAVar10->__Pos).Y;
                local_50.Z = (pAVar10->__Pos).Z;
                pPVar9 = ClassForSpawn(&local_64);
                pAVar11 = AActor::StaticSpawn(pPVar9,&local_50,ALLOW_REPLACE,false);
                if (iVar4 == 2) {
                  local_68.ID = S_FindSound("ironlich/attack1");
                  S_Sound(self,4,&local_68,1.0,1.0);
                }
                (pAVar11->target).field_0 = (pAVar10->target).field_0;
                (pAVar11->Angles).Yaw.Degrees = (pAVar10->Angles).Yaw.Degrees;
                (pAVar11->Vel).Z = (pAVar10->Vel).Z;
                (pAVar11->Vel).Y = (pAVar10->Vel).Y;
                (pAVar11->Vel).X = (pAVar10->Vel).X;
                pAVar11->Damage = (VMFunction *)0x0;
                pAVar11->health = iVar4;
                P_CheckMissileSpawn(pAVar11,self->radius);
                iVar4 = iVar4 + 2;
              } while (iVar4 != 0xc);
              return 0;
            }
            pAVar11 = P_SpawnMissile(self,pAVar10,
                                     (PClassActor *)AWhirlwind::RegistrationInfo.MyClass,
                                     (AActor *)0x0);
            if (pAVar11 == (AActor *)0x0) {
              return 0;
            }
            (pAVar11->__Pos).Z = (pAVar11->__Pos).Z + -32.0;
            (pAVar11->tracer).field_0.p = pAVar10;
            pAVar11->health = 700;
            iVar4 = S_FindSound("ironlich/attack3");
            sound_id = &local_60;
          }
          sound_id->ID = iVar4;
          S_Sound(self,4,sound_id,1.0,1.0);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005a5e6c:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005a5e97:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LichAttack)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	AActor *fire;
	AActor *baseFire;
	AActor *mo;
	AActor *target;
	int randAttack;
	static const int atkResolve1[] = { 50, 150 };
	static const int atkResolve2[] = { 150, 200 };

	// Ice ball		(close 20% : far 60%)
	// Fire column	(close 40% : far 20%)
	// Whirlwind	(close 40% : far 20%)
	// Distance threshold = 8 cells

	target = self->target;
	if (target == NULL)
	{
		return 0;
	}
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = pr_atk.HitDice (6);
		int newdam = P_DamageMobj (target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, target, self);
		return 0;
	}
	int dist = self->Distance2D(target) > 8 * 64;
	randAttack = pr_atk ();
	if (randAttack < atkResolve1[dist])
	{ // Ice ball
		P_SpawnMissile (self, target, PClass::FindActor("HeadFX1"));
		S_Sound (self, CHAN_BODY, "ironlich/attack2", 1, ATTN_NORM);
	}
	else if (randAttack < atkResolve2[dist])
	{ // Fire column
		baseFire = P_SpawnMissile (self, target, PClass::FindActor("HeadFX3"));
		if (baseFire != NULL)
		{
			baseFire->SetState (baseFire->FindState("NoGrow"));
			for (i = 0; i < 5; i++)
			{
				fire = Spawn("HeadFX3", baseFire->Pos(), ALLOW_REPLACE);
				if (i == 0)
				{
					S_Sound (self, CHAN_BODY, "ironlich/attack1", 1, ATTN_NORM);
				}
				fire->target = baseFire->target;
				fire->Angles.Yaw = baseFire->Angles.Yaw;
				fire->Vel = baseFire->Vel;
				fire->Damage = NULL;
				fire->health = (i+1) * 2;
				P_CheckMissileSpawn (fire, self->radius);
			}
		}
	}
	else
	{ // Whirlwind
		mo = P_SpawnMissile (self, target, RUNTIME_CLASS(AWhirlwind));
		if (mo != NULL)
		{
			mo->AddZ(-32);
			mo->tracer = target;
			mo->health = 20*TICRATE; // Duration
			S_Sound (self, CHAN_BODY, "ironlich/attack3", 1, ATTN_NORM);
		}
	}
	return 0;
}